

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacAlgorithm.cpp
# Opt level: O1

bool __thiscall MacAlgorithm::verifyInit(MacAlgorithm *this,SymmetricKey *key)

{
  if ((key != (SymmetricKey *)0x0) && (this->currentOperation == NONE)) {
    this->currentOperation = VERIFY;
    this->currentKey = key;
    return true;
  }
  return false;
}

Assistant:

bool MacAlgorithm::verifyInit(const SymmetricKey* key)
{
	if ((key == NULL) || (currentOperation != NONE))
	{
		return false;
	}

	currentOperation = VERIFY;
	currentKey = key;

	return true;
}